

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLocusTanFixedRadiusArc.cpp
# Opt level: O0

bool ParseLocusTanFixedRadiusArc(string *sLine1,string *sLine2,string *sLine3)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  double dVar5;
  double dVar6;
  string local_8c8;
  double local_8a8;
  double dLon_1;
  double local_880;
  double dLat_1;
  string local_870;
  double local_850;
  string local_848;
  string local_828;
  double local_808;
  double dLon;
  double local_7e0;
  double dLat;
  undefined1 local_7d0 [8];
  string sPtIntLon;
  undefined1 local_7a8 [8];
  string sPtIntLat;
  undefined1 local_780 [8];
  string sCenterLon;
  undefined1 local_758 [8];
  string sCenterLat;
  undefined1 auStack_730 [4];
  int nVal;
  LLPoint arcCenter;
  LLPoint intersection2;
  LLPoint intersection1;
  int arcDirection;
  double arcRadius;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  undefined1 local_4f0 [8];
  Locus locus2;
  Locus locus1;
  string local_420;
  undefined4 local_400;
  string local_3f0;
  undefined1 local_3d0 [8];
  string sTestId;
  string sTanPt2Lon;
  string sTanPt2Lat;
  string sTanPt1Lon;
  string sTanPt1Lat;
  string sArcCenterLon;
  string sArcCenterLat;
  string sArcDirection;
  string sArcRadius;
  string sLocus2EndDist;
  string sLocus2StartDist;
  string sLocus2EndLong;
  string sLocus2EndLat;
  string sLocus2StartLong;
  string sLocus2StartLat;
  string sLocus2GeoEndLong;
  string sLocus2GeoEndLat;
  string sLocus2GeoStartLong;
  string sLocus2GeoStartLat;
  string sLocus1EndDist;
  string sLocus1StartDist;
  string sLocus1EndLong;
  string sLocus1EndLat;
  string sLocus1StartLong;
  string sLocus1StartLat;
  string sLocus1GeoEndLong;
  string sLocus1GeoEndLat;
  string sLocus1GeoStartLong;
  string sLocus1GeoStartLat;
  bool bPassed;
  string *sLine3_local;
  string *sLine2_local;
  string *sLine1_local;
  
  std::__cxx11::string::string((string *)(sLocus1GeoStartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus1GeoEndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus1GeoEndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus1StartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus1StartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus1EndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus1EndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus1StartDist.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus1EndDist.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2GeoStartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2GeoStartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2GeoEndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2GeoEndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2StartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2StartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2EndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2EndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2StartDist.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2EndDist.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sArcRadius.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sArcDirection.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sArcCenterLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sArcCenterLon.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sTanPt1Lat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sTanPt1Lon.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sTanPt2Lat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sTanPt2Lon.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sTestId.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_3d0);
  std::__cxx11::string::string((string *)&local_3f0,(string *)sLine1);
  bVar1 = ParseLocusTanFixedRadiusArc1
                    (&local_3f0,(string *)local_3d0,
                     (string *)((long)&sLocus1GeoStartLong.field_2 + 8),
                     (string *)((long)&sLocus1GeoEndLat.field_2 + 8),
                     (string *)((long)&sLocus1GeoEndLong.field_2 + 8),
                     (string *)((long)&sLocus1StartLat.field_2 + 8),
                     (string *)((long)&sLocus1StartLong.field_2 + 8),
                     (string *)((long)&sLocus1EndLat.field_2 + 8),
                     (string *)((long)&sLocus1EndLong.field_2 + 8),
                     (string *)((long)&sLocus1StartDist.field_2 + 8),
                     (string *)((long)&sLocus1EndDist.field_2 + 8),
                     (string *)((long)&sLocus2GeoStartLat.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_3f0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::string((string *)&local_420,(string *)sLine2);
    bVar1 = ParseLocusTanFixedRadiusArc2
                      (&local_420,(string *)((long)&sLocus2GeoStartLong.field_2 + 8),
                       (string *)((long)&sLocus2GeoEndLat.field_2 + 8),
                       (string *)((long)&sLocus2GeoEndLong.field_2 + 8),
                       (string *)((long)&sLocus2StartLat.field_2 + 8),
                       (string *)((long)&sLocus2StartLong.field_2 + 8),
                       (string *)((long)&sLocus2EndLat.field_2 + 8),
                       (string *)((long)&sLocus2EndLong.field_2 + 8),
                       (string *)((long)&sLocus2StartDist.field_2 + 8),
                       (string *)((long)&sLocus2EndDist.field_2 + 8),
                       (string *)((long)&sArcRadius.field_2 + 8),
                       (string *)((long)&sArcDirection.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_420);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::__cxx11::string::string((string *)&locus1.lineType,(string *)sLine3);
      bVar1 = ParseLocusTanFixedRadiusArc3
                        ((string *)&locus1.lineType,(string *)((long)&sArcCenterLat.field_2 + 8),
                         (string *)((long)&sArcCenterLon.field_2 + 8),
                         (string *)((long)&sTanPt1Lat.field_2 + 8),
                         (string *)((long)&sTanPt1Lon.field_2 + 8),
                         (string *)((long)&sTanPt2Lat.field_2 + 8),
                         (string *)((long)&sTanPt2Lon.field_2 + 8),
                         (string *)((long)&sTestId.field_2 + 8));
      std::__cxx11::string::~string((string *)&locus1.lineType);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        GeoCalcs::LOCUS::LOCUS((LOCUS *)&locus2.lineType);
        GeoCalcs::LOCUS::LOCUS((LOCUS *)local_4f0);
        std::__cxx11::string::string
                  ((string *)&local_510,(string *)(sLocus1GeoStartLong.field_2._M_local_buf + 8));
        dVar5 = ParseLatitude(&local_510);
        dVar5 = Deg2Rad(dVar5);
        std::__cxx11::string::string
                  ((string *)&local_530,(string *)(sLocus1GeoEndLat.field_2._M_local_buf + 8));
        dVar6 = ParseLongitude(&local_530);
        dVar6 = Deg2Rad(dVar6);
        GeoCalcs::LLPOINT::Set((LLPOINT *)&locus2.lineType,dVar5,dVar6);
        std::__cxx11::string::~string((string *)&local_530);
        std::__cxx11::string::~string((string *)&local_510);
        std::__cxx11::string::string
                  ((string *)&local_550,(string *)(sLocus1GeoEndLong.field_2._M_local_buf + 8));
        dVar5 = ParseLatitude(&local_550);
        dVar5 = Deg2Rad(dVar5);
        std::__cxx11::string::string
                  ((string *)&local_570,(string *)(sLocus1StartLat.field_2._M_local_buf + 8));
        dVar6 = ParseLongitude(&local_570);
        dVar6 = Deg2Rad(dVar6);
        GeoCalcs::LLPOINT::Set((LLPOINT *)&locus1.geoStart.longitude,dVar5,dVar6);
        std::__cxx11::string::~string((string *)&local_570);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::string
                  ((string *)&local_590,(string *)(sLocus1StartLong.field_2._M_local_buf + 8));
        dVar5 = ParseLatitude(&local_590);
        dVar5 = Deg2Rad(dVar5);
        std::__cxx11::string::string
                  ((string *)&local_5b0,(string *)(sLocus1EndLat.field_2._M_local_buf + 8));
        dVar6 = ParseLongitude(&local_5b0);
        dVar6 = Deg2Rad(dVar6);
        GeoCalcs::LLPOINT::Set((LLPOINT *)&locus1.geoEnd.longitude,dVar5,dVar6);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::__cxx11::string::~string((string *)&local_590);
        std::__cxx11::string::string
                  ((string *)&local_5d0,(string *)(sLocus1EndLong.field_2._M_local_buf + 8));
        dVar5 = ParseLatitude(&local_5d0);
        dVar5 = Deg2Rad(dVar5);
        std::__cxx11::string::string
                  ((string *)&local_5f0,(string *)(sLocus1StartDist.field_2._M_local_buf + 8));
        dVar6 = ParseLongitude(&local_5f0);
        dVar6 = Deg2Rad(dVar6);
        GeoCalcs::LLPOINT::Set((LLPOINT *)&locus1.locusStart.longitude,dVar5,dVar6);
        std::__cxx11::string::~string((string *)&local_5f0);
        std::__cxx11::string::~string((string *)&local_5d0);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        dVar5 = atof(pcVar3);
        locus1.locusEnd.longitude = NmToMeters(dVar5);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        dVar5 = atof(pcVar3);
        locus1.startDist = NmToMeters(dVar5);
        std::__cxx11::string::string
                  ((string *)&local_610,(string *)(sLocus2GeoStartLong.field_2._M_local_buf + 8));
        dVar5 = ParseLatitude(&local_610);
        dVar5 = Deg2Rad(dVar5);
        std::__cxx11::string::string
                  ((string *)&local_630,(string *)(sLocus2GeoEndLat.field_2._M_local_buf + 8));
        dVar6 = ParseLongitude(&local_630);
        dVar6 = Deg2Rad(dVar6);
        GeoCalcs::LLPOINT::Set((LLPOINT *)local_4f0,dVar5,dVar6);
        std::__cxx11::string::~string((string *)&local_630);
        std::__cxx11::string::~string((string *)&local_610);
        std::__cxx11::string::string
                  ((string *)&local_650,(string *)(sLocus2GeoEndLong.field_2._M_local_buf + 8));
        dVar5 = ParseLatitude(&local_650);
        dVar5 = Deg2Rad(dVar5);
        std::__cxx11::string::string
                  ((string *)&local_670,(string *)(sLocus2StartLat.field_2._M_local_buf + 8));
        dVar6 = ParseLongitude(&local_670);
        dVar6 = Deg2Rad(dVar6);
        GeoCalcs::LLPOINT::Set((LLPOINT *)&locus2.geoStart.longitude,dVar5,dVar6);
        std::__cxx11::string::~string((string *)&local_670);
        std::__cxx11::string::~string((string *)&local_650);
        std::__cxx11::string::string
                  ((string *)&local_690,(string *)(sLocus2StartLong.field_2._M_local_buf + 8));
        dVar5 = ParseLatitude(&local_690);
        dVar5 = Deg2Rad(dVar5);
        std::__cxx11::string::string
                  ((string *)&local_6b0,(string *)(sLocus2EndLat.field_2._M_local_buf + 8));
        dVar6 = ParseLongitude(&local_6b0);
        dVar6 = Deg2Rad(dVar6);
        GeoCalcs::LLPOINT::Set((LLPOINT *)&locus2.geoEnd.longitude,dVar5,dVar6);
        std::__cxx11::string::~string((string *)&local_6b0);
        std::__cxx11::string::~string((string *)&local_690);
        std::__cxx11::string::string
                  ((string *)&local_6d0,(string *)(sLocus2EndLong.field_2._M_local_buf + 8));
        dVar5 = ParseLatitude(&local_6d0);
        dVar5 = Deg2Rad(dVar5);
        std::__cxx11::string::string
                  ((string *)&arcRadius,(string *)(sLocus2StartDist.field_2._M_local_buf + 8));
        dVar6 = ParseLongitude((string *)&arcRadius);
        dVar6 = Deg2Rad(dVar6);
        GeoCalcs::LLPOINT::Set((LLPOINT *)&locus2.locusStart.longitude,dVar5,dVar6);
        std::__cxx11::string::~string((string *)&arcRadius);
        std::__cxx11::string::~string((string *)&local_6d0);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        dVar5 = atof(pcVar3);
        locus2.locusEnd.longitude = NmToMeters(dVar5);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        dVar5 = atof(pcVar3);
        locus2.startDist = NmToMeters(dVar5);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        dVar5 = atof(pcVar3);
        dVar5 = NmToMeters(dVar5);
        GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)&intersection2.longitude);
        GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)&arcCenter.longitude);
        GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)auStack_730);
        sCenterLat.field_2._12_4_ =
             GeoCalcs::LocusTanFixedRadiusArc
                       ((Locus *)&locus2.lineType,(Locus *)local_4f0,dVar5,
                        (int *)((long)&intersection1.longitude + 4),(LLPoint *)auStack_730,
                        (LLPoint *)&intersection2.longitude,(LLPoint *)&arcCenter.longitude,1e-09,
                        5e-16);
        if (sCenterLat.field_2._12_4_ == 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"\n");
          poVar4 = std::operator<<(poVar4,(string *)local_3d0);
          std::operator<<(poVar4,"failed: Expected solution, found none.");
          sLocus1GeoStartLat.field_2._M_local_buf[0xf] = '\0';
        }
        else {
          sCenterLon.field_2._8_8_ = Rad2Deg(_auStack_730);
          ConvertLatitudeDdToDms_abi_cxx11_
                    ((string *)local_758,(double *)((long)&sCenterLon.field_2 + 8));
          sPtIntLat.field_2._8_8_ = Rad2Deg(arcCenter.latitude);
          ConvertLongitudeDdToDms_abi_cxx11_
                    ((string *)local_780,(double *)((long)&sPtIntLat.field_2 + 8));
          sPtIntLon.field_2._8_8_ = Rad2Deg(intersection2.longitude);
          ConvertLatitudeDdToDms_abi_cxx11_
                    ((string *)local_7a8,(double *)((long)&sPtIntLon.field_2 + 8));
          dLat = Rad2Deg(intersection1.latitude);
          ConvertLongitudeDdToDms_abi_cxx11_((string *)local_7d0,&dLat);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          iVar2 = atoi(pcVar3);
          bVar1 = iVar2 != intersection1.longitude._4_4_;
          if (bVar1) {
            poVar4 = std::operator<<((ostream *)&std::cout,"\n");
            poVar4 = std::operator<<(poVar4,(string *)local_3d0);
            poVar4 = std::operator<<(poVar4," failed: Expected Arc direction: ");
            poVar4 = std::operator<<(poVar4,(string *)(sArcCenterLat.field_2._M_local_buf + 8));
            poVar4 = std::operator<<(poVar4,"  calced: ");
            std::ostream::operator<<(poVar4,intersection1.longitude._4_4_);
          }
          sLocus1GeoStartLat.field_2._M_local_buf[0xf] = !bVar1;
          iVar2 = std::__cxx11::string::compare((string *)local_7a8);
          if (iVar2 != 0) {
            std::__cxx11::string::string
                      ((string *)&dLon,(string *)(sTanPt1Lon.field_2._M_local_buf + 8));
            dVar5 = ParseLatitude((string *)&dLon);
            dVar5 = Deg2Rad(dVar5);
            std::__cxx11::string::~string((string *)&dLon);
            local_7e0 = dVar5;
            bVar1 = IsApprox(dVar5,intersection2.longitude,1e-10);
            if (bVar1) {
              poVar4 = std::operator<<((ostream *)&std::cout,"\n");
              poVar4 = std::operator<<(poVar4,(string *)local_3d0);
              poVar4 = std::operator<<(poVar4,
                                       " within rounding tolerance of 1e-10: Tan Pt1 Latitude: ");
              poVar4 = std::operator<<(poVar4,(string *)(sTanPt1Lon.field_2._M_local_buf + 8));
              poVar4 = std::operator<<(poVar4," calced: ");
              std::operator<<(poVar4,(string *)local_7a8);
            }
            else {
              poVar4 = std::operator<<((ostream *)&std::cout,"\n");
              poVar4 = std::operator<<(poVar4,(string *)local_3d0);
              poVar4 = std::operator<<(poVar4," failed: Expected Tan Pt1 latitude: ");
              poVar4 = std::operator<<(poVar4,(string *)(sTanPt1Lon.field_2._M_local_buf + 8));
              poVar4 = std::operator<<(poVar4,"  calced: ");
              std::operator<<(poVar4,(string *)local_7a8);
              sLocus1GeoStartLat.field_2._M_local_buf[0xf] = '\0';
            }
          }
          iVar2 = std::__cxx11::string::compare((string *)local_7d0);
          if (iVar2 != 0) {
            std::__cxx11::string::string
                      ((string *)&local_828,(string *)(sTanPt2Lat.field_2._M_local_buf + 8));
            dVar5 = ParseLongitude(&local_828);
            dVar5 = Deg2Rad(dVar5);
            std::__cxx11::string::~string((string *)&local_828);
            local_808 = dVar5;
            bVar1 = IsApprox(dVar5,intersection1.latitude,1e-10);
            if (bVar1) {
              poVar4 = std::operator<<((ostream *)&std::cout,"\n");
              poVar4 = std::operator<<(poVar4,(string *)local_3d0);
              poVar4 = std::operator<<(poVar4,
                                       " within rounding tolerance of 1e-10: Tan Pt1 Longitude: ");
              poVar4 = std::operator<<(poVar4,(string *)(sTanPt2Lat.field_2._M_local_buf + 8));
              poVar4 = std::operator<<(poVar4," calced: ");
              std::operator<<(poVar4,(string *)local_7d0);
            }
            else {
              poVar4 = std::operator<<((ostream *)&std::cout,"\n");
              poVar4 = std::operator<<(poVar4,(string *)local_3d0);
              poVar4 = std::operator<<(poVar4," failed: Expected Tan Pt1 longitude: ");
              poVar4 = std::operator<<(poVar4,(string *)(sTanPt2Lat.field_2._M_local_buf + 8));
              poVar4 = std::operator<<(poVar4,"  calced: ");
              std::operator<<(poVar4,(string *)local_7d0);
              sLocus1GeoStartLat.field_2._M_local_buf[0xf] = '\0';
            }
          }
          local_850 = Rad2Deg(arcCenter.longitude);
          ConvertLatitudeDdToDms_abi_cxx11_(&local_848,&local_850);
          std::__cxx11::string::operator=((string *)local_7a8,(string *)&local_848);
          std::__cxx11::string::~string((string *)&local_848);
          dLat_1 = Rad2Deg(intersection2.latitude);
          ConvertLongitudeDdToDms_abi_cxx11_(&local_870,&dLat_1);
          std::__cxx11::string::operator=((string *)local_7d0,(string *)&local_870);
          std::__cxx11::string::~string((string *)&local_870);
          iVar2 = std::__cxx11::string::compare((string *)local_7a8);
          if (iVar2 != 0) {
            std::__cxx11::string::string
                      ((string *)&dLon_1,(string *)(sTanPt2Lon.field_2._M_local_buf + 8));
            dVar5 = ParseLatitude((string *)&dLon_1);
            dVar5 = Deg2Rad(dVar5);
            std::__cxx11::string::~string((string *)&dLon_1);
            local_880 = dVar5;
            bVar1 = IsApprox(dVar5,arcCenter.longitude,1e-10);
            if (bVar1) {
              poVar4 = std::operator<<((ostream *)&std::cout,"\n");
              poVar4 = std::operator<<(poVar4,(string *)local_3d0);
              poVar4 = std::operator<<(poVar4,
                                       " within rounding tolerance of 1e-10: Tan Pt2 Latitude: ");
              poVar4 = std::operator<<(poVar4,(string *)(sTanPt2Lon.field_2._M_local_buf + 8));
              poVar4 = std::operator<<(poVar4," calced: ");
              std::operator<<(poVar4,(string *)local_7a8);
            }
            else {
              poVar4 = std::operator<<((ostream *)&std::cout,"\n");
              poVar4 = std::operator<<(poVar4,(string *)local_3d0);
              poVar4 = std::operator<<(poVar4," failed: Expected Tan Pt2 latitude: ");
              poVar4 = std::operator<<(poVar4,(string *)(sTanPt2Lon.field_2._M_local_buf + 8));
              poVar4 = std::operator<<(poVar4,"  calced: ");
              std::operator<<(poVar4,(string *)local_7a8);
              sLocus1GeoStartLat.field_2._M_local_buf[0xf] = '\0';
            }
          }
          iVar2 = std::__cxx11::string::compare((string *)local_7d0);
          if (iVar2 != 0) {
            std::__cxx11::string::string
                      ((string *)&local_8c8,(string *)(sTestId.field_2._M_local_buf + 8));
            dVar5 = ParseLongitude(&local_8c8);
            dVar5 = Deg2Rad(dVar5);
            std::__cxx11::string::~string((string *)&local_8c8);
            local_8a8 = dVar5;
            bVar1 = IsApprox(dVar5,intersection2.latitude,1e-10);
            if (bVar1) {
              poVar4 = std::operator<<((ostream *)&std::cout,"\n");
              poVar4 = std::operator<<(poVar4,(string *)local_3d0);
              poVar4 = std::operator<<(poVar4,
                                       " within rounding tolerance of 1e-10: Tan Pt2 Longitude: ");
              poVar4 = std::operator<<(poVar4,(string *)(sTestId.field_2._M_local_buf + 8));
              poVar4 = std::operator<<(poVar4," calced: ");
              std::operator<<(poVar4,(string *)local_7d0);
            }
            else {
              poVar4 = std::operator<<((ostream *)&std::cout,"\n");
              poVar4 = std::operator<<(poVar4,(string *)local_3d0);
              poVar4 = std::operator<<(poVar4," failed: Expected Tan Pt2 longitude: ");
              poVar4 = std::operator<<(poVar4,(string *)(sTestId.field_2._M_local_buf + 8));
              poVar4 = std::operator<<(poVar4,"  calced: ");
              std::operator<<(poVar4,(string *)local_7d0);
              sLocus1GeoStartLat.field_2._M_local_buf[0xf] = '\0';
            }
          }
          std::__cxx11::string::~string((string *)local_7d0);
          std::__cxx11::string::~string((string *)local_7a8);
          std::__cxx11::string::~string((string *)local_780);
          std::__cxx11::string::~string((string *)local_758);
        }
        sLine1_local._7_1_ = (bool)sLocus1GeoStartLat.field_2._M_local_buf[0xf];
      }
      else {
        sLine1_local._7_1_ = false;
      }
    }
    else {
      sLine1_local._7_1_ = false;
    }
  }
  else {
    sLine1_local._7_1_ = false;
  }
  local_400 = 1;
  std::__cxx11::string::~string((string *)local_3d0);
  std::__cxx11::string::~string((string *)(sTestId.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sTanPt2Lon.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sTanPt2Lat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sTanPt1Lon.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sTanPt1Lat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sArcCenterLon.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sArcCenterLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sArcDirection.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sArcRadius.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2EndDist.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2StartDist.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2EndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2EndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2StartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2StartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2GeoEndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2GeoEndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2GeoStartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2GeoStartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus1EndDist.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus1StartDist.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus1EndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus1EndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus1StartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus1StartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus1GeoEndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus1GeoEndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus1GeoStartLong.field_2._M_local_buf + 8));
  return sLine1_local._7_1_;
}

Assistant:

bool ParseLocusTanFixedRadiusArc(string sLine1, string sLine2, string sLine3)
{
    bool bPassed = true;

    string sLocus1GeoStartLat, sLocus1GeoStartLong, sLocus1GeoEndLat, sLocus1GeoEndLong;
    string sLocus1StartLat, sLocus1StartLong, sLocus1EndLat, sLocus1EndLong;
    string sLocus1StartDist, sLocus1EndDist;

    string sLocus2GeoStartLat, sLocus2GeoStartLong, sLocus2GeoEndLat, sLocus2GeoEndLong;
    string sLocus2StartLat, sLocus2StartLong, sLocus2EndLat, sLocus2EndLong;
    string sLocus2StartDist, sLocus2EndDist;
    string sArcRadius;

    string sArcDirection, sArcCenterLat, sArcCenterLon, sTanPt1Lat, sTanPt1Lon, sTanPt2Lat, sTanPt2Lon;

    string sTestId;

    if (!ParseLocusTanFixedRadiusArc1(sLine1, sTestId, sLocus1GeoStartLat, sLocus1GeoStartLong, sLocus1GeoEndLat,
                                      sLocus1GeoEndLong,
                                      sLocus1StartLat, sLocus1StartLong, sLocus1EndLat, sLocus1EndLong,
                                      sLocus1StartDist, sLocus1EndDist))
        return false;

    if (!ParseLocusTanFixedRadiusArc2(sLine2, sLocus2GeoStartLat, sLocus2GeoStartLong, sLocus2GeoEndLat,
                                      sLocus2GeoEndLong,
                                      sLocus2StartLat, sLocus2StartLong, sLocus2EndLat, sLocus2EndLong,
                                      sLocus2StartDist, sLocus2EndDist, sArcRadius))
        return false;

    if (!ParseLocusTanFixedRadiusArc3(sLine3, sArcDirection, sArcCenterLat, sArcCenterLon, sTanPt1Lat, sTanPt1Lon,
                                      sTanPt2Lat, sTanPt2Lon))
        return false;

    Locus locus1, locus2;
    locus1.geoStart.Set(Deg2Rad(ParseLatitude(sLocus1GeoStartLat)), Deg2Rad(ParseLongitude(sLocus1GeoStartLong)));
    locus1.geoEnd.Set(Deg2Rad(ParseLatitude(sLocus1GeoEndLat)), Deg2Rad(ParseLongitude(sLocus1GeoEndLong)));
    locus1.locusStart.Set(Deg2Rad(ParseLatitude(sLocus1StartLat)), Deg2Rad(ParseLongitude(sLocus1StartLong)));
    locus1.locusEnd.Set(Deg2Rad(ParseLatitude(sLocus1EndLat)), Deg2Rad(ParseLongitude(sLocus1EndLong)));
    locus1.startDist = NmToMeters(atof(sLocus1StartDist.c_str()));
    locus1.endDist = NmToMeters(atof(sLocus1EndDist.c_str()));

    locus2.geoStart.Set(Deg2Rad(ParseLatitude(sLocus2GeoStartLat)), Deg2Rad(ParseLongitude(sLocus2GeoStartLong)));
    locus2.geoEnd.Set(Deg2Rad(ParseLatitude(sLocus2GeoEndLat)), Deg2Rad(ParseLongitude(sLocus2GeoEndLong)));
    locus2.locusStart.Set(Deg2Rad(ParseLatitude(sLocus2StartLat)), Deg2Rad(ParseLongitude(sLocus2StartLong)));
    locus2.locusEnd.Set(Deg2Rad(ParseLatitude(sLocus2EndLat)), Deg2Rad(ParseLongitude(sLocus2EndLong)));
    locus2.startDist = NmToMeters(atof(sLocus2StartDist.c_str()));
    locus2.endDist = NmToMeters(atof(sLocus2EndDist.c_str()));

    double arcRadius = NmToMeters(atof(sArcRadius.c_str()));
    int arcDirection;
    LLPoint intersection1, intersection2;
    LLPoint arcCenter;
    int nVal = LocusTanFixedRadiusArc(locus1, locus2, arcRadius, arcDirection, arcCenter,
                                      intersection1, intersection2, kTol, kEps);

    if (nVal == 0)
    {
        cout << "\n" << sTestId << "failed: Expected solution, found none.";
        bPassed = false;

    }
    else
    {
        string sCenterLat = ConvertLatitudeDdToDms(Rad2Deg(arcCenter.latitude));
        string sCenterLon = ConvertLongitudeDdToDms(Rad2Deg(arcCenter.longitude));
        string sPtIntLat = ConvertLatitudeDdToDms(Rad2Deg(intersection1.latitude));
        string sPtIntLon = ConvertLongitudeDdToDms(Rad2Deg(intersection1.longitude));

        if (atoi(sArcDirection.c_str()) != arcDirection)
        {
            cout << "\n" << sTestId << " failed: Expected Arc direction: " << sArcDirection << "  calced: " <<
            arcDirection;
            bPassed = false;
        }

        if (sPtIntLat.compare(sTanPt1Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(sTanPt1Lat));
            if (IsApprox(dLat, intersection1.latitude, 1e-10))
                cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Tan Pt1 Latitude: " << sTanPt1Lat <<
                " calced: " << sPtIntLat;
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tan Pt1 latitude: " << sTanPt1Lat << "  calced: " <<
                sPtIntLat;
                bPassed = false;
            }
        }
        if (sPtIntLon.compare(sTanPt1Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLongitude(sTanPt1Lon));
            if (IsApprox(dLon, intersection1.longitude, 1e-10))
                cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Tan Pt1 Longitude: " << sTanPt1Lon <<
                " calced: " << sPtIntLon;
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tan Pt1 longitude: " << sTanPt1Lon << "  calced: " <<
                sPtIntLon;
                bPassed = false;
            }
        }

        sPtIntLat = ConvertLatitudeDdToDms(Rad2Deg(intersection2.latitude));
        sPtIntLon = ConvertLongitudeDdToDms(Rad2Deg(intersection2.longitude));

        if (sPtIntLat.compare(sTanPt2Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(sTanPt2Lat));
            if (IsApprox(dLat, intersection2.latitude, 1e-10))
                cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Tan Pt2 Latitude: " << sTanPt2Lat <<
                " calced: " << sPtIntLat;
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tan Pt2 latitude: " << sTanPt2Lat << "  calced: " <<
                sPtIntLat;
                bPassed = false;
            }
        }
        if (sPtIntLon.compare(sTanPt2Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLongitude(sTanPt2Lon));
            if (IsApprox(dLon, intersection2.longitude, 1e-10))
                cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Tan Pt2 Longitude: " << sTanPt2Lon <<
                " calced: " << sPtIntLon;
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tan Pt2 longitude: " << sTanPt2Lon << "  calced: " <<
                sPtIntLon;
                bPassed = false;
            }
        }

    }
    return bPassed;
}